

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

char * kj::_::fillLimited<kj::ArrayPtr<char>,kj::StringPtr&>
                 (char *target,char *limit,ArrayPtr<char> *first,StringPtr *rest)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  
  sVar2 = first->size_;
  if (sVar2 != 0) {
    pcVar3 = first->ptr;
    sVar4 = 0;
    do {
      pcVar1 = target + sVar4;
      if (pcVar1 == limit) {
        return pcVar1;
      }
      *pcVar1 = pcVar3[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    target = target + sVar4;
  }
  pcVar3 = (rest->content).ptr;
  sVar2 = (rest->content).size_;
  if (target != limit && pcVar3 != pcVar3 + (sVar2 - 1)) {
    lVar5 = 1;
    do {
      *target = pcVar3[lVar5 + -1];
      target = target + 1;
      if ((2 - sVar2) + lVar5 == 1) {
        return target;
      }
      lVar5 = lVar5 + 1;
    } while (target != limit);
  }
  return target;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }